

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  ImVector<unsigned_int> *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImFont **ppIVar4;
  ImFont *font;
  ImGuiContext *pIVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ImVec4 border_col;
  ImVec4 local_68;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  
  lVar8 = (long)(atlas->Fonts).Size;
  if (lVar8 != 0) {
    ppIVar4 = (atlas->Fonts).Data;
    lVar7 = 0;
    do {
      font = *(ImFont **)((long)ppIVar4 + lVar7);
      PushID(font);
      DebugNodeFont(font);
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
      lVar7 = lVar7 + 8;
    } while (lVar8 * 8 != lVar7);
  }
  bVar6 = TreeNode("Font Atlas","Font Atlas (%dx%d pixels)",(ulong)(uint)atlas->TexWidth,
                   (ulong)(uint)atlas->TexHeight);
  pIVar5 = GImGui;
  if (bVar6) {
    Checkbox("Tint with Text Color",&(GImGui->DebugMetricsConfig).ShowAtlasTintedWithTextColor);
    if ((pIVar5->DebugMetricsConfig).ShowAtlasTintedWithTextColor == true) {
      local_68.x = (GImGui->Style).Colors[0].x;
      local_68.y = (GImGui->Style).Colors[0].y;
      local_68.z = (GImGui->Style).Colors[0].z;
      local_68.w = (GImGui->Style).Colors[0].w;
    }
    else {
      local_68.x = 1.0;
      local_68.y = 1.0;
      local_68.z = 1.0;
      local_68.w = 1.0;
    }
    local_38.x = (GImGui->Style).Colors[5].x;
    local_38.y = (GImGui->Style).Colors[5].y;
    local_38.z = (GImGui->Style).Colors[5].z;
    local_38.w = (GImGui->Style).Colors[5].w;
    uVar2 = atlas->TexWidth;
    uVar3 = atlas->TexHeight;
    local_40.y = (float)(int)uVar3;
    local_40.x = (float)(int)uVar2;
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_50.x = 1.0;
    local_50.y = 1.0;
    Image(atlas->TexID,&local_40,&local_48,&local_50,&local_68,&local_38);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (ImFont* font : atlas->Fonts)
    {
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Font Atlas", "Font Atlas (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImGuiContext& g = *GImGui;
        ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
        Checkbox("Tint with Text Color", &cfg->ShowAtlasTintedWithTextColor); // Using text color ensure visibility of core atlas data, but will alter custom colored icons
        ImVec4 tint_col = cfg->ShowAtlasTintedWithTextColor ? GetStyleColorVec4(ImGuiCol_Text) : ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = GetStyleColorVec4(ImGuiCol_Border);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}